

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O3

void do_vanish(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  ROOM_INDEX_DATA *pRoomIndex;
  char *txt;
  long lVar5;
  
  iVar3 = get_skill(ch,(int)gsn_vanish);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar5 = (long)gsn_vanish;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar5 * 0x60 + 0x44e788 + (long)iVar4 * 2) <= sVar1) {
      bVar2 = is_affected(ch,(int)gsn_vanish);
      if (bVar2) {
        txt = "You cannot vanish again so soon.\n\r";
      }
      else if (ch->mana < 0x14) {
        txt = "You don\'t have the mana.";
      }
      else {
        WAIT_STATE(ch,0xc);
        iVar4 = number_percent();
        if (((double)iVar3 * 0.95 < (double)iVar4) || ((ch->in_room->room_flags[0] & 0x802000) != 0)
           ) {
          send_to_char("You attempt to vanish without trace but fail.\n\r",ch);
          act("$n attempts to slide into the shadows but fails.",ch,(void *)0x0,(void *)0x0,0);
          check_improve(ch,(int)gsn_vanish,false,2);
          ch->mana = ch->mana + -10;
          return;
        }
        ch->mana = ch->mana + -0x14;
        iVar3 = 100000;
        do {
          number_range(0,30000);
          pRoomIndex = get_room_index(0);
          if ((((pRoomIndex != (ROOM_INDEX_DATA *)0x0) && (pRoomIndex->area == ch->in_room->area))
              && ((pRoomIndex->room_flags[0] & 0x200) == 0)) && (pRoomIndex->guild == 0)) {
            bVar2 = can_see_room(ch,pRoomIndex);
            if (((bVar2) && ((pRoomIndex->room_flags[0] & 0x800) == 0)) &&
               ((ch->in_room->vnum != 0x4bc && (pRoomIndex->vnum != 0x4bc)))) {
              stop_fighting(ch,true);
              act("$n suddenly vanishes into the shadows!",ch,(void *)0x0,(void *)0x0,0);
              send_to_char("You slip into the shadows and vanish!\n\r",ch);
              char_from_room(ch);
              char_to_room(ch,pRoomIndex);
              act("$n appears from the shadows.",ch,(void *)0x0,(void *)0x0,0);
              do_look(ch,"auto");
              WAIT_STATE(ch,0x18);
              return;
            }
          }
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        ch->mana = ch->mana + 0x14;
        txt = "You failed.";
      }
      goto LAB_0025798f;
    }
  }
  txt = "Huh?\n\r";
LAB_0025798f:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_vanish(CHAR_DATA *ch, char *argument)
{
	auto chance = get_skill(ch, gsn_vanish);
	if (chance == 0 || ch->level < skill_table[gsn_vanish].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_vanish))
	{
		send_to_char("You cannot vanish again so soon.\n\r", ch);
		return;
	}

	if (ch->mana < 20)
	{
		send_to_char("You don't have the mana.", ch);
		return;
	}

	WAIT_STATE(ch, PULSE_VIOLENCE);

	if (number_percent() > (chance * .95)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_SUMMON_FROM))
	{
		send_to_char("You attempt to vanish without trace but fail.\n\r", ch);
		act("$n attempts to slide into the shadows but fails.", ch, 0, 0, TO_ROOM);

		check_improve(ch, gsn_vanish, false, 2);

		ch->mana -= 10;

		return;
	}

	ch->mana -= 20;

	auto found = false;
	ROOM_INDEX_DATA *pRoomIndex;
	for (auto nocrash = 0; nocrash < 100000; nocrash++)
	{
		pRoomIndex = get_room_index(number_range(0, 30000));
		if (pRoomIndex == nullptr)
			continue;

		if (pRoomIndex->area == ch->in_room->area
			&& !IS_SET(pRoomIndex->room_flags, ROOM_PRIVATE)
			&& pRoomIndex->guild == 0
			&& can_see_room(ch, pRoomIndex)
			&& !IS_SET(pRoomIndex->room_flags, ROOM_SOLITARY)
			&& ch->in_room->vnum != 1212
			&& pRoomIndex->vnum != 1212)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		ch->mana += 20;

		send_to_char("You failed.", ch);
		return;
	}

	stop_fighting(ch, true);

	act("$n suddenly vanishes into the shadows!", ch, 0, 0, TO_ROOM);
	send_to_char("You slip into the shadows and vanish!\n\r", ch);

	char_from_room(ch);
	char_to_room(ch, pRoomIndex);

	act("$n appears from the shadows.", ch, 0, 0, TO_ROOM);

	do_look(ch, "auto");

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}